

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

char * cmGetDefinition(void *arg,char *def)

{
  char *pcVar1;
  allocator<char> local_49;
  string local_48;
  cmValue local_28;
  void *local_20;
  cmMakefile *mf;
  char *def_local;
  void *arg_local;
  
  local_20 = arg;
  mf = (cmMakefile *)def;
  def_local = (char *)arg;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,def,&local_49);
  local_28 = cmMakefile::GetDefinition((cmMakefile *)arg,&local_48);
  pcVar1 = cmValue::GetCStr(&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  return pcVar1;
}

Assistant:

static const char* CCONV cmGetDefinition(void* arg, const char* def)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  return mf->GetDefinition(def).GetCStr();
}